

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall pugi::xpath_node_set::_move(xpath_node_set *this,xpath_node_set *rhs)

{
  xpath_node *pxVar1;
  xml_attribute_struct *pxVar2;
  xpath_node *pxVar3;
  
  this->_type = rhs->_type;
  pxVar1 = rhs->_storage;
  pxVar2 = rhs->_storage[0]._attribute._attr;
  this->_storage[0]._node._root = rhs->_storage[0]._node._root;
  this->_storage[0]._attribute._attr = pxVar2;
  pxVar3 = this->_storage;
  if (rhs->_begin != pxVar1) {
    pxVar3 = rhs->_begin;
  }
  this->_begin = pxVar3;
  this->_end = (xpath_node *)(((long)rhs->_end - (long)rhs->_begin) + (long)pxVar3);
  rhs->_type = type_unsorted;
  rhs->_begin = pxVar1;
  rhs->_end = pxVar1;
  return;
}

Assistant:

PUGI_IMPL_FN void xpath_node_set::_move(xpath_node_set& rhs) PUGIXML_NOEXCEPT
	{
		_type = rhs._type;
		_storage[0] = rhs._storage[0];
		_begin = (rhs._begin == rhs._storage) ? _storage : rhs._begin;
		_end = _begin + (rhs._end - rhs._begin);

		rhs._type = type_unsorted;
		rhs._begin = rhs._storage;
		rhs._end = rhs._storage;
	}